

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HouseholderSequence.h
# Opt level: O3

void __thiscall
Eigen::
HouseholderSequence<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,-1,true>,Eigen::VectorBlock<Eigen::Matrix<float,-1,1,0,-1,1>const,-1>,1>
::applyThisOnTheLeft<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Matrix<float,1,1,1,1,1>>
          (HouseholderSequence<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,_1,true>,Eigen::VectorBlock<Eigen::Matrix<float,_1,1,0,_1,1>const,_1>,1>
           *this,Matrix<float,__1,_1,_0,__1,_1> *dst,Matrix<float,_1,_1,_1,_1,_1> *workspace,
          bool inputIsIdentity)

{
  HouseholderSequence<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,_1,true>,Eigen::VectorBlock<Eigen::Matrix<float,_1,1,0,_1,1>const,_1>,1>
  HVar1;
  float *pfVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  float *local_d0;
  ulong local_c8;
  ulong local_c0;
  Matrix<float,__1,_1,_0,__1,_1> *local_b8;
  ulong local_b0;
  ulong local_a8;
  long local_a0;
  EssentialVectorType local_98;
  
  lVar7 = *(long *)(this + 0x78);
  if (0 < lVar7) {
    HVar1 = this[0x70];
    lVar5 = -1;
    lVar8 = 0;
    do {
      lVar7 = lVar7 + lVar5;
      if (this[0x70] !=
          (HouseholderSequence<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,_1,true>,Eigen::VectorBlock<Eigen::Matrix<float,_1,1,0,_1,1>const,_1>,1>
           )0x0) {
        lVar7 = lVar8;
      }
      local_c8 = *(long *)(this + 8) - (*(long *)(this + 0x80) + lVar7);
      local_c0 = 1;
      if ((((byte)HVar1 ^ 1) & inputIsIdentity) != 0) {
        local_c0 = local_c8;
      }
      pfVar2 = (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      lVar3 = (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
      uVar6 = lVar3 - local_c8;
      uVar4 = 1 - local_c0;
      local_d0 = pfVar2 + uVar6 + uVar4 * lVar3;
      if ((long)(local_c0 | local_c8) < 0 && pfVar2 != (float *)0x0) {
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/MapBase.h"
                      ,0xb2,
                      "Eigen::MapBase<Eigen::Block<Eigen::Matrix<float, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<float, -1, 1>>, Level = 0]"
                     );
      }
      local_b8 = dst;
      local_b0 = uVar6;
      local_a8 = uVar4;
      local_a0 = lVar3;
      if (((long)(local_c8 | uVar6) < 0) || ((long)(uVar4 | local_c0) < 0)) {
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                      ,0x93,
                      "Eigen::Block<Eigen::Matrix<float, -1, 1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<float, -1, 1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                     );
      }
      HouseholderSequence<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_Eigen::VectorBlock<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1>,_1>
      ::essentialVector(&local_98,
                        (HouseholderSequence<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,_Eigen::VectorBlock<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1>,_1>
                         *)this,lVar7);
      MatrixBase<Eigen::Block<Eigen::Matrix<float,-1,1,0,-1,1>,-1,-1,false>>::
      applyHouseholderOnTheLeft<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,_1,true>const,_1,1,false>>
                ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,_1,false>> *)&local_d0
                 ,&local_98,(Scalar *)(lVar7 * 4 + *(long *)(this + 0x38)),(Scalar *)workspace);
      lVar8 = lVar8 + 1;
      lVar7 = *(long *)(this + 0x78);
      lVar5 = lVar5 + -1;
    } while (lVar8 < lVar7);
  }
  return;
}

Assistant:

inline void applyThisOnTheLeft(Dest& dst, Workspace& workspace, bool inputIsIdentity = false) const
    {
      if(inputIsIdentity && m_reverse)
        inputIsIdentity = false;
      // if the entries are large enough, then apply the reflectors by block
      if(m_length>=BlockSize && dst.cols()>1)
      {
        // Make sure we have at least 2 useful blocks, otherwise it is point-less:
        Index blockSize = m_length<Index(2*BlockSize) ? (m_length+1)/2 : Index(BlockSize);
        for(Index i = 0; i < m_length; i+=blockSize)
        {
          Index end = m_reverse ? (std::min)(m_length,i+blockSize) : m_length-i;
          Index k = m_reverse ? i : (std::max)(Index(0),end-blockSize);
          Index bs = end-k;
          Index start = k + m_shift;

          typedef Block<typename internal::remove_all<VectorsType>::type,Dynamic,Dynamic> SubVectorsType;
          SubVectorsType sub_vecs1(m_vectors.const_cast_derived(), Side==OnTheRight ? k : start,
                                                                   Side==OnTheRight ? start : k,
                                                                   Side==OnTheRight ? bs : m_vectors.rows()-start,
                                                                   Side==OnTheRight ? m_vectors.cols()-start : bs);
          typename internal::conditional<Side==OnTheRight, Transpose<SubVectorsType>, SubVectorsType&>::type sub_vecs(sub_vecs1);

          Index dstStart = dst.rows()-rows()+m_shift+k;
          Index dstRows  = rows()-m_shift-k;
          Block<Dest,Dynamic,Dynamic> sub_dst(dst,
                                              dstStart,
                                              inputIsIdentity ? dstStart : 0,
                                              dstRows,
                                              inputIsIdentity ? dstRows : dst.cols());
          apply_block_householder_on_the_left(sub_dst, sub_vecs, m_coeffs.segment(k, bs), !m_reverse);
        }
      }
      else
      {
        workspace.resize(dst.cols());
        for(Index k = 0; k < m_length; ++k)
        {
          Index actual_k = m_reverse ? k : m_length-k-1;
          Index dstStart = rows()-m_shift-actual_k;
          dst.bottomRightCorner(dstStart, inputIsIdentity ? dstStart : dst.cols())
            .applyHouseholderOnTheLeft(essentialVector(actual_k), m_coeffs.coeff(actual_k), workspace.data());
        }
      }
    }